

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

JSON_Status json_object_dotset_value(JSON_Object *object,char *name,JSON_Value *value)

{
  JSON_Status JVar1;
  char *pcVar2;
  JSON_Value *pJVar3;
  JSON_Object *object_00;
  char *name_00;
  size_t name_len;
  
  if (value != (JSON_Value *)0x0) {
    while( true ) {
      if (object == (JSON_Object *)0x0) {
        return -1;
      }
      if (name == (char *)0x0) {
        return -1;
      }
      pcVar2 = strchr(name,0x2e);
      if (pcVar2 == (char *)0x0) {
        JVar1 = json_object_set_value(object,name,value);
        return JVar1;
      }
      name_len = (long)pcVar2 - (long)name;
      pJVar3 = json_object_getn_value(object,name,name_len);
      if (pJVar3 == (JSON_Value *)0x0) break;
      if (pJVar3->type != 4) {
        return -1;
      }
      object = (pJVar3->value).object;
      name = pcVar2 + 1;
    }
    pJVar3 = json_value_init_object();
    if (pJVar3 == (JSON_Value *)0x0) {
      return -1;
    }
    if (pJVar3->type == 4) {
      object_00 = (pJVar3->value).object;
    }
    else {
      object_00 = (JSON_Object *)0x0;
    }
    pcVar2 = pcVar2 + 1;
    JVar1 = json_object_dotset_value(object_00,pcVar2,value);
    if (JVar1 != 0) {
      json_value_free(pJVar3);
      return -1;
    }
    name_00 = (char *)(*parson_malloc)(name_len + 1);
    if (name_00 == (char *)0x0) {
      json_object_dotremove_internal(object_00,pcVar2,0);
    }
    else {
      name_00[name_len] = '\0';
      memcpy(name_00,name,name_len);
      JVar1 = json_object_add(object,name_00,pJVar3);
      if (JVar1 == 0) {
        return 0;
      }
      (*parson_free)(name_00);
      json_object_dotremove_internal(object_00,pcVar2,0);
    }
    json_value_free(pJVar3);
  }
  return -1;
}

Assistant:

JSON_Status json_object_dotset_value(JSON_Object *object, const char *name, JSON_Value *value) {
    const char *dot_pos = NULL;
    JSON_Value *temp_value = NULL, *new_value = NULL;
    JSON_Object *temp_object = NULL, *new_object = NULL;
    JSON_Status status = JSONFailure;
    size_t name_len = 0;
    char *name_copy = NULL;
    
    if (object == NULL || name == NULL || value == NULL) {
        return JSONFailure;
    }
    dot_pos = strchr(name, '.');
    if (dot_pos == NULL) {
        return json_object_set_value(object, name, value);
    }
    name_len = dot_pos - name;
    temp_value = json_object_getn_value(object, name, name_len);
    if (temp_value) {
        /* Don't overwrite existing non-object (unlike json_object_set_value, but it shouldn't be changed at this point) */
        if (json_value_get_type(temp_value) != JSONObject) {
            return JSONFailure;
        }
        temp_object = json_value_get_object(temp_value);
        return json_object_dotset_value(temp_object, dot_pos + 1, value);
    }
    new_value = json_value_init_object();
    if (new_value == NULL) {
        return JSONFailure;
    }
    new_object = json_value_get_object(new_value);
    status = json_object_dotset_value(new_object, dot_pos + 1, value);
    if (status != JSONSuccess) {
        json_value_free(new_value);
        return JSONFailure;
    }
    name_copy = parson_strndup(name, name_len);
    if (!name_copy) {
        json_object_dotremove_internal(new_object, dot_pos + 1, 0);
        json_value_free(new_value);
        return JSONFailure;
    }
    status = json_object_add(object, name_copy, new_value);
    if (status != JSONSuccess) {
        parson_free(name_copy);
        json_object_dotremove_internal(new_object, dot_pos + 1, 0);
        json_value_free(new_value);
        return JSONFailure;
    }
    return JSONSuccess;
}